

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool extend_array(roaring_array_t *ra,int32_t k)

{
  int local_28;
  int32_t local_24;
  int32_t new_capacity;
  int32_t desired_size;
  int32_t k_local;
  roaring_array_t *ra_local;
  
  local_28 = ra->size + k;
  if (local_28 < 0x10001) {
    if (ra->allocation_size < local_28) {
      if (ra->size < 0x400) {
        local_28 = local_28 * 2;
      }
      else {
        local_28 = (local_28 * 5) / 4;
      }
      local_24 = local_28;
      if (0x10000 < local_28) {
        local_24 = 0x10000;
      }
      ra_local._7_1_ = realloc_array(ra,local_24);
    }
    else {
      ra_local._7_1_ = true;
    }
    return ra_local._7_1_;
  }
  __assert_fail("desired_size <= MAX_CONTAINERS",
                "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                ,0x46e9,"_Bool extend_array(roaring_array_t *, int32_t)");
}

Assistant:

bool extend_array(roaring_array_t *ra, int32_t k) {
    int32_t desired_size = ra->size + k;
    assert(desired_size <= MAX_CONTAINERS);
    if (desired_size > ra->allocation_size) {
        int32_t new_capacity =
            (ra->size < 1024) ? 2 * desired_size : 5 * desired_size / 4;
        if (new_capacity > MAX_CONTAINERS) {
            new_capacity = MAX_CONTAINERS;
        }

        return realloc_array(ra, new_capacity);
    }
    return true;
}